

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElectricityBill.cpp
# Opt level: O0

string * __thiscall
ElectricityBill::DoQuery_abi_cxx11_
          (string *__return_storage_ptr__,ElectricityBill *this,RoomInfo *room_info)

{
  size_type in_R8;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  string local_a8 [32];
  string local_88 [32];
  string *local_68;
  size_type local_60;
  allocator<char> local_41;
  string local_40 [32];
  RoomInfo *local_20;
  RoomInfo *room_info_local;
  ElectricityBill *this_local;
  
  local_20 = room_info;
  room_info_local = (RoomInfo *)this;
  this_local = (ElectricityBill *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40,"sh",&local_41);
  std::operator+(&local_c8,&this->text_root_,&SH_FILE_abi_cxx11_);
  std::__cxx11::string::string(local_a8,(string *)local_20);
  std::__cxx11::string::string(local_88,(string *)&local_20->roomname);
  local_68 = &local_c8;
  local_60 = 3;
  args._M_len = in_R8;
  args._M_array = (iterator)0x3;
  higan::System::RunShellCommand(__return_storage_ptr__,(System *)local_40,local_68,args);
  local_f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_68;
  do {
    local_f8 = local_f8 + -1;
    std::__cxx11::string::~string((string *)local_f8);
  } while (local_f8 != &local_c8);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  return __return_storage_ptr__;
}

Assistant:

std::string ElectricityBill::DoQuery(const RoomInfo& room_info)
{
	return higan::System::RunShellCommand("sh",
			{text_root_ + SH_FILE, room_info.flatname, room_info.roomname});
}